

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonPal.h
# Opt level: O2

int get_cpuid(int *cpuInfo,int function_id)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  uVar5 = function_id & 0x80000000;
  if (uVar5 == 0) {
    puVar1 = (uint *)cpuid_basic_info(0);
  }
  else if (uVar5 == 1) {
    puVar1 = (uint *)cpuid_Version_info(1);
  }
  else if (uVar5 == 2) {
    puVar1 = (uint *)cpuid_cache_tlb_info(2);
  }
  else if (uVar5 == 3) {
    puVar1 = (uint *)cpuid_serial_info(3);
  }
  else if (uVar5 == 4) {
    puVar1 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (uVar5 == 5) {
    puVar1 = (uint *)cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (uVar5 == 6) {
    puVar1 = (uint *)cpuid_Thermal_Power_Management_info(6);
  }
  else if (uVar5 == 7) {
    puVar1 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (uVar5 == 9) {
    puVar1 = (uint *)cpuid_Direct_Cache_Access_info(9);
  }
  else if (uVar5 == 10) {
    puVar1 = (uint *)cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (uVar5 == 0xb) {
    puVar1 = (uint *)cpuid_Extended_Topology_info(0xb);
  }
  else if (uVar5 == 0xd) {
    puVar1 = (uint *)cpuid_Processor_Extended_States_info(0xd);
  }
  else if (uVar5 == 0xf) {
    puVar1 = (uint *)cpuid_Quality_of_Service_info(0xf);
  }
  else if (uVar5 == 0x80000002) {
    puVar1 = (uint *)cpuid_brand_part1_info(0x80000002);
  }
  else if (uVar5 == 0x80000003) {
    puVar1 = (uint *)cpuid_brand_part2_info(0x80000003);
  }
  else if (uVar5 == 0x80000004) {
    puVar1 = (uint *)cpuid_brand_part3_info(0x80000004);
  }
  else {
    puVar1 = (uint *)cpuid(uVar5);
  }
  iVar6 = 0;
  if ((uint)function_id <= *puVar1 && *puVar1 != 0) {
    if (function_id == 0) {
      piVar2 = (int *)cpuid_basic_info(0);
    }
    else if (function_id == 1) {
      piVar2 = (int *)cpuid_Version_info(1);
    }
    else if (function_id == 2) {
      piVar2 = (int *)cpuid_cache_tlb_info(2);
    }
    else if (function_id == 3) {
      piVar2 = (int *)cpuid_serial_info(3);
    }
    else if (function_id == 4) {
      piVar2 = (int *)cpuid_Deterministic_Cache_Parameters_info(4);
    }
    else if (function_id == 5) {
      piVar2 = (int *)cpuid_MONITOR_MWAIT_Features_info(5);
    }
    else if (function_id == 6) {
      piVar2 = (int *)cpuid_Thermal_Power_Management_info(6);
    }
    else if (function_id == 7) {
      piVar2 = (int *)cpuid_Extended_Feature_Enumeration_info(7);
    }
    else if (function_id == 9) {
      piVar2 = (int *)cpuid_Direct_Cache_Access_info(9);
    }
    else if (function_id == 10) {
      piVar2 = (int *)cpuid_Architectural_Performance_Monitoring_info(10);
    }
    else if (function_id == 0xb) {
      piVar2 = (int *)cpuid_Extended_Topology_info(0xb);
    }
    else if (function_id == 0xd) {
      piVar2 = (int *)cpuid_Processor_Extended_States_info(0xd);
    }
    else if (function_id == 0xf) {
      piVar2 = (int *)cpuid_Quality_of_Service_info(0xf);
    }
    else if (function_id == -0x7ffffffe) {
      piVar2 = (int *)cpuid_brand_part1_info(0x80000002);
    }
    else if (function_id == -0x7ffffffd) {
      piVar2 = (int *)cpuid_brand_part2_info(0x80000003);
    }
    else if (function_id == -0x7ffffffc) {
      piVar2 = (int *)cpuid_brand_part3_info(0x80000004);
    }
    else {
      piVar2 = (int *)cpuid(function_id);
    }
    iVar6 = piVar2[1];
    iVar3 = piVar2[2];
    iVar4 = piVar2[3];
    *cpuInfo = *piVar2;
    cpuInfo[1] = iVar6;
    cpuInfo[2] = iVar4;
    cpuInfo[3] = iVar3;
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

inline int get_cpuid(int cpuInfo[4], int function_id)
{
    return __get_cpuid(
            static_cast<unsigned int>(function_id),
            reinterpret_cast<unsigned int*>(&cpuInfo[0]),
            reinterpret_cast<unsigned int*>(&cpuInfo[1]),
            reinterpret_cast<unsigned int*>(&cpuInfo[2]),
            reinterpret_cast<unsigned int*>(&cpuInfo[3]));
}